

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ispring::File::FileList
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *dir_path,string *ext,bool recursive)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  DIR *__dirp;
  dirent *pdVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *temp;
  _Alloc_hider _Var9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allow_ext;
  string path_ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string str_exp;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = (dir_path->_M_dataplus)._M_p[dir_path->_M_string_length - 1];
  if ((cVar1 != '/') && (cVar1 != '\\')) {
    std::__cxx11::string::push_back((char)dir_path);
  }
  std::operator+(&str_exp,dir_path,"*.*");
  allow_ext.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allow_ext.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allow_ext.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar10 = 0; uVar10 < ext->_M_string_length; uVar10 = uVar10 + sVar3 + 1) {
    std::__cxx11::string::find((char)ext,0x3b);
    std::__cxx11::string::substr((ulong)&str,(ulong)ext);
    sVar2 = str._M_string_length;
    _Var9 = str._M_dataplus;
    for (sVar11 = 0; sVar3 = str._M_string_length, sVar2 != sVar11; sVar11 = sVar11 + 1) {
      iVar6 = toupper((int)_Var9._M_p[sVar11]);
      _Var9._M_p[sVar11] = (char)iVar6;
    }
    std::__cxx11::string::rfind((char)&str,0x2e);
    std::__cxx11::string::substr((ulong)&path_ext,(ulong)&str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&allow_ext,
               &path_ext);
    std::__cxx11::string::~string((string *)&path_ext);
    std::__cxx11::string::~string((string *)&str);
  }
  __dirp = opendir((dir_path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar7 = readdir(__dirp);
      if (pdVar7 == (dirent *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,pdVar7->d_name,(allocator<char> *)&path_ext);
      if (pdVar7->d_type == '\b') {
        std::__cxx11::string::rfind((char)&str,0x2e);
        std::__cxx11::string::substr((ulong)&path_ext,(ulong)&str);
        sVar2 = path_ext._M_string_length;
        _Var9 = path_ext._M_dataplus;
        for (sVar11 = 0; sVar2 != sVar11; sVar11 = sVar11 + 1) {
          iVar6 = toupper((int)_Var9._M_p[sVar11]);
          _Var9._M_p[sVar11] = (char)iVar6;
        }
        lVar12 = 0;
        lVar4 = 0;
        do {
          lVar8 = lVar4;
          uVar10 = (long)allow_ext.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)allow_ext.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((int)(uVar10 >> 5) <= lVar8) goto LAB_0012ac60;
          bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&((allow_ext.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar12),&path_ext);
          lVar12 = lVar12 + 0x20;
          lVar4 = lVar8 + 1;
        } while (bVar5);
        uVar10 = (long)allow_ext.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)allow_ext.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_0012ac60:
        if ((int)lVar8 < (int)(uVar10 >> 5)) {
LAB_0012ac78:
          std::operator+(&local_50,dir_path,&str);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          bVar5 = std::operator==(allow_ext.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"*");
          if (bVar5) goto LAB_0012ac78;
        }
        std::__cxx11::string::~string((string *)&path_ext);
      }
      else if (recursive) {
        bVar5 = std::operator!=(&str,".");
        if (bVar5) {
          bVar5 = std::operator!=(&str,"..");
          if (bVar5) {
            std::operator+(&local_b0,dir_path,&str);
            std::__cxx11::string::string((string *)&local_70,(string *)ext);
            FileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&path_ext,&local_b0,&local_70,true);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_b0);
            sVar2 = path_ext._M_string_length;
            for (_Var9 = path_ext._M_dataplus; _Var9._M_p != (pointer)sVar2;
                _Var9._M_p = _Var9._M_p + 0x20) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(__return_storage_ptr__,(value_type *)_Var9._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&path_ext);
          }
        }
      }
      std::__cxx11::string::~string((string *)&str);
    }
    closedir(__dirp);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allow_ext);
  std::__cxx11::string::~string((string *)&str_exp);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> FileList(std::string dir_path, std::string ext, bool recursive = false) {
			std::vector<std::string> paths; //return value
			if (dir_path.back() != '/' && dir_path.back() != '\\') {
				dir_path.push_back('/');
			}
			std::string str_exp = dir_path + "*.*";
			std::vector<std::string> allow_ext;
			std::string::size_type offset = 0;
			while (offset < ext.length()) {
				std::string str = ext.substr(offset, ext.find(';', offset) - offset);
				std::transform(str.begin(), str.end(), str.begin(), toupper);
				offset += str.length() + 1;
				std::string::size_type pos = str.find_last_of('.');
				pos = pos == std::string::npos ? 0 : pos + 1;
				allow_ext.push_back(str.substr(pos, str.length()));
			}
			DIR* fd=opendir(dir_path.c_str());
			if (fd == NULL) {
				return paths;
			}
			struct dirent* hFind=NULL;
			while(hFind=readdir(fd)){
				std::string path = hFind->d_name;
				if(hFind->d_type==DT_REG) {    //is File?
					std::string path_ext = path.substr(path.find_last_of('.') + 1, path.length());  //파일의 확장자 추출
					std::transform(path_ext.begin(), path_ext.end(), path_ext.begin(), toupper);
					int i = -1;
					while (++i < (int) allow_ext.size() && allow_ext[i] != path_ext);
					if (i < (int) allow_ext.size() || allow_ext.front() == "*") {    //allow_ext에 포함되어있으면
						paths.push_back(dir_path + path);
					}
				}else if (recursive == true && path != "." && path != "..") {	//is Directory?
					std::vector<std::string> temps = FileList(dir_path + path, ext, recursive);
					for (auto&temp : temps) {
						paths.push_back(temp);
					}
				}
			}
			closedir(fd);
			return paths;   //RVO
		}